

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O0

ssize_t tnt_io_sendv_raw(tnt_stream_net *s,iovec *iov,int count,int all)

{
  tnt_iob_txv_t p_Var1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  int local_5c;
  ulong local_38;
  ssize_t r;
  size_t total;
  int all_local;
  int count_local;
  iovec *iov_local;
  tnt_stream_net *s_local;
  
  r = 0;
  total._4_4_ = count;
  _all_local = iov;
  do {
    if (total._4_4_ < 1) {
      return r;
    }
    if ((s->sbuf).txv == (tnt_iob_txv_t)0x0) {
      do {
        local_38 = writev(s->fd,(iovec *)_all_local,total._4_4_);
        bVar4 = false;
        if (local_38 == 0xffffffffffffffff) {
          piVar3 = __errno_location();
          bVar4 = *piVar3 == 4;
        }
      } while (bVar4);
    }
    else {
      p_Var1 = (s->sbuf).txv;
      iVar2 = getiovmax();
      if (total._4_4_ < iVar2) {
        local_5c = total._4_4_;
      }
      else {
        local_5c = getiovmax();
      }
      local_38 = (*p_Var1)(&s->sbuf,_all_local,local_5c);
    }
    if ((long)local_38 < 1) {
      s->error = TNT_ESYSTEM;
      piVar3 = __errno_location();
      s->errno_ = *piVar3;
      return -1;
    }
    r = local_38 + r;
    if (all == 0) {
      return r;
    }
    for (; 0 < total._4_4_; total._4_4_ = total._4_4_ + -1) {
      if (local_38 < ((iovec *)_all_local)->iov_len) {
        ((iovec *)_all_local)->iov_base = (void *)(local_38 + (long)((iovec *)_all_local)->iov_base)
        ;
        ((iovec *)_all_local)->iov_len = ((iovec *)_all_local)->iov_len - local_38;
        break;
      }
      local_38 = local_38 - ((iovec *)_all_local)->iov_len;
      _all_local = (iovec *)((iovec *)_all_local + 1);
    }
  } while( true );
}

Assistant:

ssize_t
tnt_io_sendv_raw(struct tnt_stream_net *s, struct iovec *iov, int count, int all)
{
	size_t total = 0;
	while (count > 0) {
		ssize_t r;
		if (s->sbuf.txv) {
			r = s->sbuf.txv(&s->sbuf, iov, MIN(count, getiovmax()));
		} else {
			do {
				r = writev(s->fd, iov, count);
			} while (r == -1 && (errno == EINTR));
		}
		if (r <= 0) {
			s->error = TNT_ESYSTEM;
			s->errno_ = errno;
			return -1;
		}
		total += r;
		if (!all)
			break;
		while (count > 0) {
			if (iov->iov_len > (size_t)r) {
				iov->iov_base += r;
				iov->iov_len -= r;
				break;
			} else {
				r -= iov->iov_len;
				iov++;
				count--;
			}
		}
	}
	return total;
}